

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiMultiSelectState * __thiscall
ImPool<ImGuiMultiSelectState>::Add(ImPool<ImGuiMultiSelectState> *this)

{
  ImGuiSelectionUserData *pIVar1;
  int iVar2;
  ImGuiMultiSelectState *pIVar3;
  ImGuiMultiSelectState *__dest;
  int iVar4;
  int iVar5;
  
  iVar2 = this->FreeIdx;
  if (iVar2 == (this->Buf).Size) {
    iVar4 = iVar2 + 1;
    iVar5 = (this->Buf).Capacity;
    if (iVar2 < iVar5) {
      __dest = (this->Buf).Data;
      iVar5 = iVar4;
    }
    else {
      if (iVar5 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar5 / 2 + iVar5;
      }
      if (iVar5 <= iVar4) {
        iVar5 = iVar4;
      }
      __dest = (ImGuiMultiSelectState *)ImGui::MemAlloc((long)iVar5 * 0x28);
      pIVar3 = (this->Buf).Data;
      if (pIVar3 != (ImGuiMultiSelectState *)0x0) {
        memcpy(__dest,pIVar3,(long)(this->Buf).Size * 0x28);
        ImGui::MemFree((this->Buf).Data);
      }
      (this->Buf).Data = __dest;
      (this->Buf).Capacity = iVar5;
      iVar5 = this->FreeIdx + 1;
    }
    (this->Buf).Size = iVar4;
  }
  else {
    __dest = (this->Buf).Data;
    iVar5 = *(int *)&__dest[iVar2].Window;
  }
  this->FreeIdx = iVar5;
  pIVar3 = __dest + iVar2;
  pIVar3->Window = (ImGuiWindow *)0x0;
  pIVar3->ID = 0;
  pIVar3->LastFrameActive = 0;
  __dest[iVar2].LastSelectionSize = 0;
  __dest[iVar2].RangeSelected = -1;
  __dest[iVar2].NavIdSelected = -1;
  pIVar1 = &__dest[iVar2].RangeSrcItem;
  *(undefined4 *)pIVar1 = 0xffffffff;
  *(undefined4 *)((long)pIVar1 + 4) = 0xffffffff;
  *(undefined4 *)(pIVar1 + 1) = 0xffffffff;
  *(undefined4 *)((long)pIVar1 + 0xc) = 0xffffffff;
  this->AliveCount = this->AliveCount + 1;
  return (this->Buf).Data + iVar2;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }